

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_dr_wav_s24_to_s32(ma_int32 *pOut,ma_uint8 *pIn,size_t sampleCount)

{
  size_t sVar1;
  byte *pbVar2;
  
  if (sampleCount != 0 && (pIn != (ma_uint8 *)0x0 && pOut != (ma_int32 *)0x0)) {
    pbVar2 = pIn + 2;
    sVar1 = 0;
    do {
      pOut[sVar1] = (uint)*pbVar2 << 0x18 | (uint)*(ushort *)(pbVar2 + -2) << 8;
      sVar1 = sVar1 + 1;
      pbVar2 = pbVar2 + 3;
    } while (sampleCount != sVar1);
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_s24_to_s32(ma_int32* pOut, const ma_uint8* pIn, size_t sampleCount)
{
    size_t i;
    if (pOut == NULL || pIn == NULL) {
        return;
    }
    for (i = 0; i < sampleCount; ++i) {
        unsigned int s0 = pIn[i*3 + 0];
        unsigned int s1 = pIn[i*3 + 1];
        unsigned int s2 = pIn[i*3 + 2];
        ma_int32 sample32 = (ma_int32)((s0 << 8) | (s1 << 16) | (s2 << 24));
        *pOut++ = sample32;
    }
}